

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Tbc::Text::Text(Text *this,string *_str,TextAttributes *_attr)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined3 uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  size_t sVar9;
  long lVar10;
  char cVar11;
  size_t sVar12;
  ulong _pos;
  string remainder;
  string wrappableChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b8;
  Text *local_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  long local_60;
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_68 = &(this->str).field_2;
  (this->str)._M_dataplus._M_p = (pointer)local_68;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  sVar12 = _attr->indent;
  sVar9 = _attr->width;
  uVar3 = *(undefined4 *)((long)&_attr->width + 4);
  cVar11 = _attr->tabChar;
  uVar5 = *(undefined3 *)&_attr->field_0x19;
  uVar4 = *(undefined4 *)&_attr->field_0x1c;
  (this->attr).initialIndent = _attr->initialIndent;
  (this->attr).indent = sVar12;
  *(int *)&(this->attr).width = (int)sVar9;
  *(undefined4 *)((long)&(this->attr).width + 4) = uVar3;
  (this->attr).tabChar = cVar11;
  *(undefined3 *)&(this->attr).field_0x19 = uVar5;
  *(undefined4 *)&(this->attr).field_0x1c = uVar4;
  local_b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50[0] = local_40;
  local_b0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50," [({.,/|\\-","");
  sVar12 = _attr->initialIndent;
  if (sVar12 == 0xffffffffffffffff) {
    sVar12 = _attr->indent;
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar2 = (_str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + _str->_M_string_length);
  if (local_d8._M_string_length != 0) {
    do {
      if (0x7ce0 < (ulong)((long)(this->lines).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->lines).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"... message truncated due to excessive size","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_b8,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        break;
      }
      _pos = _attr->width - sVar12;
      if (local_d8._M_string_length <= _pos) {
        _pos = local_d8._M_string_length;
      }
      cVar11 = (char)&local_d8;
      uVar6 = std::__cxx11::string::find(cVar11,10);
      if (uVar6 < _pos) {
        _pos = uVar6;
      }
      lVar7 = std::__cxx11::string::rfind(cVar11,(ulong)(uint)(int)_attr->tabChar);
      if (lVar7 != -1) {
        cVar11 = local_d8._M_dataplus._M_p[_pos];
        local_58 = sVar12;
        std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_d8);
        local_60 = lVar7;
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_d8);
        uVar6 = 0xf;
        if (local_88 != local_78) {
          uVar6 = local_78[0];
        }
        if (uVar6 < (ulong)(local_a0 + local_80)) {
          uVar6 = 0xf;
          if (local_a8 != local_98) {
            uVar6 = local_98[0];
          }
          if (uVar6 < (ulong)(local_a0 + local_80)) goto LAB_0018072b;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
        }
        else {
LAB_0018072b:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8);
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        psVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_f8.field_2._M_allocated_capacity = *psVar1;
          local_f8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar1;
          local_f8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_f8._M_string_length = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        if (local_a8 != local_98) {
          operator_delete(local_a8);
        }
        if (local_88 != local_78) {
          operator_delete(local_88);
        }
        _pos = _pos - (cVar11 == '\n');
        this = local_b0;
        lVar7 = local_60;
        sVar12 = local_58;
      }
      if (_pos == local_d8._M_string_length) {
        spliceLine(this,sVar12,&local_d8,_pos);
      }
      else if (local_d8._M_dataplus._M_p[_pos] == '\n') {
        spliceLine(this,sVar12,&local_d8,_pos);
        if ((_pos < 2) || (local_d8._M_string_length != 1)) {
          std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
          std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
        }
        sVar12 = _attr->indent;
      }
      else {
        sVar9 = std::__cxx11::string::find_last_of((char *)&local_d8,(ulong)local_50[0],_pos);
        if (sVar9 - 1 < 0xfffffffffffffffe) {
          spliceLine(this,sVar12,&local_d8,sVar9);
          if (*local_d8._M_dataplus._M_p == ' ') {
            std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p);
            }
          }
        }
        else {
          spliceLine(this,sVar12,&local_d8,_pos - 1);
          std::__cxx11::string::append
                    ((char *)((this->lines).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1));
        }
        if ((long)(this->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->lines).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) {
          sVar12 = _attr->indent;
        }
        lVar10 = 0;
        if (lVar7 != -1) {
          lVar10 = lVar7;
        }
        sVar12 = sVar12 + lVar10;
      }
    } while (local_d8._M_string_length != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

Text( std::string const& _str, TextAttributes const& _attr = TextAttributes() )
        : attr( _attr )
        {
            std::string wrappableChars = " [({.,/|\\-";
            std::size_t indent = _attr.initialIndent != std::string::npos
                ? _attr.initialIndent
                : _attr.indent;
            std::string remainder = _str;

            while( !remainder.empty() ) {
                if( lines.size() >= 1000 ) {
                    lines.push_back( "... message truncated due to excessive size" );
                    return;
                }
                std::size_t tabPos = std::string::npos;
                std::size_t width = (std::min)( remainder.size(), _attr.width - indent );
                std::size_t pos = remainder.find_first_of( '\n' );
                if( pos <= width ) {
                    width = pos;
                }
                pos = remainder.find_last_of( _attr.tabChar, width );
                if( pos != std::string::npos ) {
                    tabPos = pos;
                    if( remainder[width] == '\n' )
                        width--;
                    remainder = remainder.substr( 0, tabPos ) + remainder.substr( tabPos+1 );
                }

                if( width == remainder.size() ) {
                    spliceLine( indent, remainder, width );
                }
                else if( remainder[width] == '\n' ) {
                    spliceLine( indent, remainder, width );
                    if( width <= 1 || remainder.size() != 1 )
                        remainder = remainder.substr( 1 );
                    indent = _attr.indent;
                }
                else {
                    pos = remainder.find_last_of( wrappableChars, width );
                    if( pos != std::string::npos && pos > 0 ) {
                        spliceLine( indent, remainder, pos );
                        if( remainder[0] == ' ' )
                            remainder = remainder.substr( 1 );
                    }
                    else {
                        spliceLine( indent, remainder, width-1 );
                        lines.back() += "-";
                    }
                    if( lines.size() == 1 )
                        indent = _attr.indent;
                    if( tabPos != std::string::npos )
                        indent += tabPos;
                }
            }
        }